

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

int CompareDoubleIncreasing(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*b <= *a) {
    uVar1 = (uint)(*b < *a);
  }
  return uVar1;
}

Assistant:

static int CompareDoubleIncreasing(const void* a, const void* b)
{
  double x = *((const double*)a);
  double y = *((const double*)b);
  if (x < y)
    return -1;
  if (x > y)
    return 1;
  return 0;
}